

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLFormatter::specialFormat
          (XMLFormatter *this,XMLCh *toFormat,XMLSize_t count,EscapeFlags escapeFlags)

{
  uint uVar1;
  XMLCh *pXVar2;
  XMLCh *local_40;
  XMLCh *tmpPtr;
  XMLCh *endPtr;
  XMLCh *srcPtr;
  EscapeFlags escapeFlags_local;
  XMLSize_t count_local;
  XMLCh *toFormat_local;
  XMLFormatter *this_local;
  
  pXVar2 = toFormat + count;
  endPtr = toFormat;
  do {
    while( true ) {
      if (pXVar2 <= endPtr) {
        return;
      }
      local_40 = endPtr;
      while ((local_40 < pXVar2 &&
             (uVar1 = (*this->fXCoder->_vptr_XMLTranscoder[4])
                                (this->fXCoder,(ulong)(ushort)*local_40), (uVar1 & 1) != 0))) {
        local_40 = local_40 + 1;
      }
      if (local_40 <= endPtr) break;
      formatBuf(this,endPtr,(long)local_40 - (long)endPtr >> 1,escapeFlags,UnRep_Fail);
      endPtr = local_40;
    }
    do {
      if (pXVar2 <= endPtr) break;
      if ((*endPtr & 0xfc00U) == 0xd800) {
        writeCharRef(this,(long)(int)(((ushort)*endPtr - 0xd800) * 0x400 + (uint)(ushort)endPtr[1] +
                                     0x2400));
        endPtr = endPtr + 1;
      }
      else {
        writeCharRef(this,endPtr);
      }
      endPtr = endPtr + 1;
      uVar1 = (*this->fXCoder->_vptr_XMLTranscoder[4])(this->fXCoder,(ulong)(ushort)*endPtr);
    } while ((uVar1 & 1) == 0);
  } while( true );
}

Assistant:

void XMLFormatter::specialFormat(const  XMLCh* const    toFormat
                                , const XMLSize_t       count
                                , const EscapeFlags     escapeFlags)
{
    //
    //  We have to check each character and see if it could be represented.
    //  As long as it can, we just keep up with where we started and how
    //  many chars we've checked. When we hit an unrepresentable one, we
    //  stop, transcode everything we've collected, then start handling
    //  the unrepresentables via char refs. We repeat this until we get all
    //  the chars done.
    //
    const XMLCh*    srcPtr = toFormat;
    const XMLCh*    endPtr = toFormat + count;

    while (srcPtr < endPtr)
    {
        const XMLCh* tmpPtr = srcPtr;
        while (tmpPtr < endPtr)
        {
            if (fXCoder->canTranscodeTo(*tmpPtr))
                tmpPtr++;
            else
                break;
        }

        if (tmpPtr > srcPtr)
        {
            // We got at least some chars that can be done normally
            formatBuf
            (
                srcPtr
                , tmpPtr - srcPtr
                , escapeFlags
                , XMLFormatter::UnRep_Fail
            );

            // Update the source pointer to our new spot
            srcPtr = tmpPtr;
        }
         else
        {

            //  We hit something unrepresentable. So continue forward doing
            //  char refs until we hit something representable again or the
            //  end of input.
            //
            while (srcPtr < endPtr)
            {
                if ((*srcPtr & 0xFC00) == 0xD800) {
                    // we have encountered a surrogate, need to recombine before printing out
                    // use writeCharRef that takes XMLSize_t to get values larger than
                    // hex 0xFFFF printed.
                    tmpPtr = srcPtr;
                    tmpPtr++; // point at low surrogate
                    writeCharRef((XMLSize_t) (0x10000+((*srcPtr-0xD800)<<10)+*tmpPtr-0xDC00));
                    srcPtr++; // advance to low surrogate (will advance again below)
                }
                else {
                    writeCharRef(*srcPtr);
                }

                // Move up the source pointer and break out if needed
                srcPtr++;
                if (fXCoder->canTranscodeTo(*srcPtr))
                    break;
            }
        }
    }
}